

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall TTD::SlabAllocatorBase<8>::AddNewBlock(SlabAllocatorBase<8> *this)

{
  Memory *this_00;
  uchar *alloc;
  SlabBlock *pSVar1;
  byte *dataArray;
  SlabBlock *newBlock;
  TrackAllocData local_40;
  SlabBlock *local_18;
  byte *allocBlock;
  SlabAllocatorBase<8> *this_local;
  
  allocBlock = (byte *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&unsigned_char::typeinfo,0,(ulong)this->m_slabBlockSize,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Debug/TTSupport.h"
             ,0x1bb);
  this_00 = (Memory *)
            Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_40);
  alloc = Memory::AllocateArray<Memory::HeapAllocator,unsigned_char,true>
                    (this_00,(HeapAllocator *)Memory::HeapAllocator::NoThrowAlloc,0,
                     (ulong)this->m_slabBlockSize);
  local_18 = (SlabBlock *)TTD_MEM_ALLOC_CHECK<unsigned_char>(alloc);
  if (((ulong)local_18 & 3) != 0) {
    TTDAbort_unrecoverable_error
              ("We have non-word aligned allocations so all our later work is not so useful");
  }
  pSVar1 = local_18 + 1;
  this->m_currPos = (byte *)pSVar1;
  this->m_endPos = (uchar *)((long)&pSVar1[-1].BlockData + (ulong)this->m_slabBlockSize);
  local_18->BlockData = (byte *)pSVar1;
  local_18->Next = (SlabBlock *)0x0;
  local_18->Previous = this->m_headBlock;
  local_18->RefCounter = 0;
  this->m_headBlock->Next = local_18;
  this->m_headBlock = local_18;
  return;
}

Assistant:

void AddNewBlock()
        {
            byte* allocBlock = TT_HEAP_ALLOC_ARRAY(byte, this->m_slabBlockSize);
            TTDAssert((reinterpret_cast<uint64>(allocBlock) & 0x3) == 0, "We have non-word aligned allocations so all our later work is not so useful");

            SlabBlock* newBlock = (SlabBlock*)allocBlock;
            byte* dataArray = (allocBlock + TTD_SLAB_BLOCK_SIZE);

            this->m_currPos = dataArray;
            this->m_endPos = dataArray + TTD_SLAB_BLOCK_USABLE_SIZE(this->m_slabBlockSize);

            newBlock->BlockData = dataArray;
            newBlock->Next = nullptr;
            newBlock->Previous = this->m_headBlock;
            newBlock->RefCounter = 0;

            this->m_headBlock->Next = newBlock;
            this->m_headBlock = newBlock;
        }